

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool P_SeekerMissile(AActor *actor,double thresh,double turnMax,bool precise,bool usecurspeed)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  AActor *target;
  undefined7 in_register_00000011;
  double dVar6;
  double dVar7;
  AActor **ppAVar8;
  DAngle local_50;
  TVector2<double> local_48;
  double local_38;
  double local_30;
  
  if ((int)CONCAT71(in_register_00000011,usecurspeed) == 0) {
    dVar6 = actor->Speed;
  }
  else {
    dVar6 = TVector3<double>::Length(&actor->Vel);
  }
  target = GC::ReadBarrier<AActor>((AActor **)&actor->tracer);
  if ((target != (AActor *)0x0) && (bVar4 = AActor::CanSeek(actor,target), bVar4)) {
    if (((target->flags).Value & 4) != 0) {
      if ((dVar6 == 0.0) && (!NAN(dVar6))) {
        return true;
      }
      iVar5 = P_FaceMobj(actor,target,(DAngle *)&local_48.Y);
      if ((thresh < local_48.Y) && (local_48.Y = local_48.Y * 0.5, turnMax < local_48.Y)) {
        local_48.Y = turnMax;
      }
      if (iVar5 == 0) {
        local_48.Y = -local_48.Y;
      }
      (actor->Angles).Yaw.Degrees = local_48.Y + (actor->Angles).Yaw.Degrees;
      if (precise) {
        dVar7 = 0.0;
        if (((actor->flags3).Value & 3) == 0) {
          dVar7 = AActor::Distance2D(actor,target,false);
          local_38 = 1.0;
          if (1.0 <= dVar7) {
            local_38 = dVar7;
          }
          dVar7 = target->Height;
          bVar4 = DObject::IsKindOf((DObject *)target,APlayerPawn::RegistrationInfo.MyClass);
          if (bVar4) {
            ppAVar8 = target[1].sprev;
          }
          else {
            ppAVar8 = (AActor **)(dVar7 * 0.5);
          }
          local_30 = ((double)ppAVar8 + (target->__Pos).Z) -
                     (actor->Height * 0.5 + (actor->__Pos).Z);
          TVector2<double>::Angle(&local_48);
          dVar7 = local_48.X;
        }
        local_50.Degrees = -dVar7;
        AActor::Vel3DFromAngle(actor,&local_50,dVar6);
        return true;
      }
      AActor::VelFromAngle(actor,dVar6);
      if (((actor->flags3).Value & 3) != 0) {
        return true;
      }
      dVar7 = (actor->__Pos).Z;
      dVar1 = actor->Height;
      dVar2 = (target->__Pos).Z;
      dVar3 = target->Height;
      if ((dVar2 <= dVar7 + dVar1) && (dVar7 <= dVar2 + dVar3)) {
        return true;
      }
      dVar6 = AActor::DistanceBySpeed(actor,target,dVar6);
      (actor->Vel).Z = ((dVar2 + dVar3 * 0.5) - (dVar7 + dVar1 * 0.5)) / dVar6;
      return true;
    }
    (actor->tracer).field_0.p = (AActor *)0x0;
  }
  return false;
}

Assistant:

bool P_SeekerMissile (AActor *actor, double thresh, double turnMax, bool precise, bool usecurspeed)
{
	int dir;
	DAngle delta;
	AActor *target;
	double speed;

	speed = !usecurspeed ? actor->Speed : actor->VelToSpeed();
	target = actor->tracer;
	if (target == NULL || !actor->CanSeek(target))
	{
		return false;
	}
	if (!(target->flags & MF_SHOOTABLE))
	{ // Target died
		actor->tracer = NULL;
		return false;
	}
	if (speed == 0)
	{ // Technically, we're not seeking since our speed is 0, but the target *is* seekable.
		return true;
	}
	dir = P_FaceMobj (actor, target, &delta);
	if (delta > thresh)
	{
		delta /= 2;
		if (delta > turnMax)
		{
			delta = turnMax;
		}
	}
	if (dir)
	{ // Turn clockwise
		actor->Angles.Yaw += delta;
	}
	else
	{ // Turn counter clockwise
		actor->Angles.Yaw -= delta;
	}
	
	if (!precise)
	{
		actor->VelFromAngle(speed);

		if (!(actor->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER)))
		{
			if (actor->Top() < target->Z() ||
				target->Top() < actor->Z())
			{ // Need to seek vertically
				actor->Vel.Z = (target->Center() - actor->Center()) / actor->DistanceBySpeed(target, speed);
			}
		}
	}
	else
	{
		DAngle pitch = 0.;
		if (!(actor->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER)))
		{ // Need to seek vertically
			double dist = MAX(1., actor->Distance2D(target));
			// Aim at a player's eyes and at the middle of the actor for everything else.
			double aimheight = target->Height/2;
			if (target->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				aimheight = static_cast<APlayerPawn *>(target)->ViewHeight;
			}
			pitch = DVector2(dist, target->Z() + aimheight - actor->Center()).Angle();
		}
		actor->Vel3DFromAngle(-pitch, speed);
	}

	return true;
}